

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestStart(StreamingListener *this,TestInfo *test_info)

{
  string *in_RDI;
  StreamingListener *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  undefined1 local_51 [33];
  string local_30 [48];
  
  this_00 = (StreamingListener *)local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_51 + 1),"event=TestStart&name=",(allocator *)this_00);
  TestInfo::name((TestInfo *)0x16f6f8);
  std::operator+(in_stack_ffffffffffffff98,(char *)this_00);
  SendLn(this_00,in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  return;
}

Assistant:

void OnTestStart(const TestInfo& test_info) {
    SendLn(std::string("event=TestStart&name=") + test_info.name());
  }